

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall List::on_click(List *this,int mx,int my)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar2 == '\0') {
    iVar2 = (this->super_Widget).y1;
    iVar3 = al_get_font_line_height(((this->super_Widget).dialog)->theme->font);
    uVar1 = (long)(my - iVar2) / (long)iVar3;
    if ((uVar1 & 0xffffffff) <
        (ulong)((long)(this->items).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->items).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      this->selected_item = (uint)uVar1;
      ((this->super_Widget).dialog)->draw_requested = true;
    }
  }
  return;
}

Assistant:

void List::on_click(int mx, int my)
{
   if (is_disabled())
      return;

   const Theme & theme = dialog->get_theme();
   unsigned int i = (my - this->y1) / al_get_font_line_height(theme.font);
   if (i < this->items.size()) {
      this->selected_item = i;
      dialog->request_draw();
   }

   (void)mx;
   (void)my;
}